

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmMakefileTargetGenerator::CreateResponseFile
          (string *__return_storage_ptr__,cmMakefileTargetGenerator *this,string *name,
          string *options,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makefile_depends,string *language)

{
  cmMakefile *this_00;
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  byte local_329;
  byte local_30b;
  char local_30a [2];
  undefined1 local_308 [8];
  cmGeneratedFileStream responseStream;
  undefined1 local_98 [8];
  string responseFileNameFull;
  allocator<char> local_61;
  string local_60;
  Encoding local_3c;
  string *psStack_38;
  codecvt_Encoding responseEncoding;
  string *language_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *makefile_depends_local;
  string *options_local;
  string *name_local;
  cmMakefileTargetGenerator *this_local;
  string *responseFileName;
  
  psStack_38 = language;
  language_local = (string *)makefile_depends;
  makefile_depends_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)options;
  options_local = name;
  name_local = (string *)this;
  this_local = (cmMakefileTargetGenerator *)__return_storage_ptr__;
  local_3c = (*(this->GlobalGenerator->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
               _vptr_cmGlobalGenerator[5])();
  bVar1 = false;
  responseFileNameFull.field_2._M_local_buf[0xb] = '\0';
  local_30b = 0;
  if (local_3c == UTF8_WITH_BOM) {
    bVar1 = std::operator==(psStack_38,"CUDA");
    local_329 = 1;
    bVar1 = !bVar1;
    if (bVar1) {
      this_00 = (this->super_cmCommonTargetGenerator).Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"MSVC",&local_61);
      responseFileNameFull.field_2._M_local_buf[0xb] = '\x01';
      bVar2 = cmMakefile::IsOn(this_00,&local_60);
      local_329 = bVar2 ^ 0xff;
    }
    local_30b = local_329;
  }
  if ((responseFileNameFull.field_2._M_local_buf[0xb] & 1U) != 0) {
    std::__cxx11::string::~string((string *)&local_60);
  }
  if (bVar1) {
    std::allocator<char>::~allocator(&local_61);
  }
  if ((local_30b & 1) != 0) {
    local_3c = UTF8;
  }
  responseStream._615_1_ = 0x2f;
  cmStrCat<std::__cxx11::string&,char,std::__cxx11::string_const&>
            ((string *)local_98,&this->TargetBuildDirectoryFull,&responseStream.field_0x267,
             options_local);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_308,(string *)local_98,false,local_3c);
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_308,true);
  poVar3 = std::operator<<((ostream *)local_308,(string *)makefile_depends_local);
  std::operator<<(poVar3,"\n");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)language_local,(value_type *)local_98);
  local_30a[1] = 0;
  local_30a[0] = '/';
  cmStrCat<std::__cxx11::string&,char,std::__cxx11::string_const&>
            (__return_storage_ptr__,&this->TargetBuildDirectory,local_30a,options_local);
  local_30a[1] = 1;
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_308);
  std::__cxx11::string::~string((string *)local_98);
  return __return_storage_ptr__;
}

Assistant:

std::string cmMakefileTargetGenerator::CreateResponseFile(
  const std::string& name, std::string const& options,
  std::vector<std::string>& makefile_depends, std::string const& language)
{
  // FIXME: Find a better way to determine the response file encoding,
  // perhaps using tool-specific platform information variables.
  // For now, use the makefile encoding as a heuristic.
  codecvt_Encoding responseEncoding =
    this->GlobalGenerator->GetMakefileEncoding();
  // Non-MSVC tooling doesn't understand BOM encoded files.
  if (responseEncoding == codecvt_Encoding::UTF8_WITH_BOM &&
      (language == "CUDA" || !this->Makefile->IsOn("MSVC"))) {
    responseEncoding = codecvt_Encoding::UTF8;
  }

  // Create the response file.
  std::string responseFileNameFull =
    cmStrCat(this->TargetBuildDirectoryFull, '/', name);
  cmGeneratedFileStream responseStream(responseFileNameFull, false,
                                       responseEncoding);
  responseStream.SetCopyIfDifferent(true);
  responseStream << options << "\n";

  // Add a dependency so the target will rebuild when the set of
  // objects changes.
  makefile_depends.push_back(std::move(responseFileNameFull));

  // Construct the name to be used on the command line.
  std::string responseFileName =
    cmStrCat(this->TargetBuildDirectory, '/', name);
  return responseFileName;
}